

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void trimFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  sqlite3_value *pVal;
  void *pvVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uchar *puVar5;
  ulong uVar6;
  uchar *puVar7;
  uint *puVar8;
  uchar **p;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uchar *local_50;
  
  pVal = *argv;
  uVar2._0_2_ = pVal->flags;
  uVar2._2_1_ = pVal->enc;
  uVar2._3_1_ = pVal->eSubtype;
  if (((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar2 & 0x3f) & 1) != 0) ||
     (local_50 = sqlite3_value_text(pVal), local_50 == (uchar *)0x0)) {
    return;
  }
  uVar2 = sqlite3_value_bytes(*argv);
  if (argc == 1) {
    puVar8 = trimFunc::lenOne;
    p = trimFunc::azOne;
    uVar6 = 1;
  }
  else {
    puVar5 = sqlite3_value_text(argv[1]);
    if (puVar5 == (uchar *)0x0) {
      return;
    }
    uVar4 = 0;
    for (puVar7 = puVar5; *puVar7 != '\0'; puVar7 = puVar7 + 1) {
      uVar4 = uVar4 + 1;
    }
    if (uVar4 == 0) goto LAB_0019a5d9;
    p = (uchar **)contextMalloc(context,(ulong)uVar4 * 0xc);
    if (p == (uchar **)0x0) {
      return;
    }
    puVar8 = (uint *)(p + uVar4);
    uVar6 = 0;
    while (*puVar5 != '\0') {
      p[uVar6] = puVar5;
      *(int *)((long)puVar8 + uVar6 * 4) = (int)(puVar5 + 1) - (int)puVar5;
      uVar6 = uVar6 + 1;
      puVar5 = puVar5 + 1;
    }
    if (uVar6 == 0) goto LAB_0019a5d9;
  }
  pvVar1 = context->pFunc->pUserData;
  if ((uVar2 != 0 & (byte)pvVar1) == 1) {
    do {
      uVar11 = 0;
      while( true ) {
        if ((uVar6 & 0xffffffff) == uVar11) goto LAB_0019a4c2;
        uVar4 = *(uint *)((long)puVar8 + uVar11 * 4);
        if ((uVar4 <= uVar2) && (iVar3 = bcmp(local_50,p[uVar11],(ulong)uVar4), iVar3 == 0)) break;
        uVar11 = uVar11 + 1;
      }
      local_50 = local_50 + uVar4;
      uVar11 = 0;
      uVar2 = uVar2 - uVar4;
    } while (uVar2 != 0);
  }
  else {
LAB_0019a4c2:
    uVar11 = (ulong)uVar2;
  }
  uVar2 = (uint)uVar11;
  if ((((ulong)pvVar1 & 2) != 0) && (uVar2 != 0)) {
LAB_0019a4d9:
    uVar2 = (uint)uVar11;
    uVar9 = 0;
    do {
      if ((uVar6 & 0xffffffff) == uVar9) break;
      uVar4 = *(uint *)((long)puVar8 + uVar9 * 4);
      if (uVar4 <= uVar2) {
        uVar10 = uVar2 - uVar4;
        uVar11 = (ulong)uVar10;
        iVar3 = bcmp(local_50 + uVar11,p[uVar9],(ulong)uVar4);
        if (iVar3 == 0) goto LAB_0019a512;
      }
      uVar9 = uVar9 + 1;
    } while( true );
  }
LAB_0019a5c5:
  if (argc != 1) {
    sqlite3_free(p);
  }
LAB_0019a5d9:
  sqlite3_result_text(context,(char *)local_50,uVar2,(_func_void_void_ptr *)0xffffffffffffffff);
  return;
LAB_0019a512:
  uVar2 = 0;
  if (uVar10 == 0) goto LAB_0019a5c5;
  goto LAB_0019a4d9;
}

Assistant:

static void trimFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *zIn;         /* Input string */
  const unsigned char *zCharSet;    /* Set of characters to trim */
  unsigned int nIn;                 /* Number of bytes in input */
  int flags;                        /* 1: trimleft  2: trimright  3: trim */
  int i;                            /* Loop counter */
  unsigned int *aLen = 0;           /* Length of each character in zCharSet */
  unsigned char **azChar = 0;       /* Individual characters in zCharSet */
  int nChar;                        /* Number of characters in zCharSet */

  if( sqlite3_value_type(argv[0])==SQLITE_NULL ){
    return;
  }
  zIn = sqlite3_value_text(argv[0]);
  if( zIn==0 ) return;
  nIn = (unsigned)sqlite3_value_bytes(argv[0]);
  assert( zIn==sqlite3_value_text(argv[0]) );
  if( argc==1 ){
    static const unsigned lenOne[] = { 1 };
    static unsigned char * const azOne[] = { (u8*)" " };
    nChar = 1;
    aLen = (unsigned*)lenOne;
    azChar = (unsigned char **)azOne;
    zCharSet = 0;
  }else if( (zCharSet = sqlite3_value_text(argv[1]))==0 ){
    return;
  }else{
    const unsigned char *z;
    for(z=zCharSet, nChar=0; *z; nChar++){
      SQLITE_SKIP_UTF8(z);
    }
    if( nChar>0 ){
      azChar = contextMalloc(context,
                     ((i64)nChar)*(sizeof(char*)+sizeof(unsigned)));
      if( azChar==0 ){
        return;
      }
      aLen = (unsigned*)&azChar[nChar];
      for(z=zCharSet, nChar=0; *z; nChar++){
        azChar[nChar] = (unsigned char *)z;
        SQLITE_SKIP_UTF8(z);
        aLen[nChar] = (unsigned)(z - azChar[nChar]);
      }
    }
  }
  if( nChar>0 ){
    flags = SQLITE_PTR_TO_INT(sqlite3_user_data(context));
    if( flags & 1 ){
      while( nIn>0 ){
        unsigned int len = 0;
        for(i=0; i<nChar; i++){
          len = aLen[i];
          if( len<=nIn && memcmp(zIn, azChar[i], len)==0 ) break;
        }
        if( i>=nChar ) break;
        zIn += len;
        nIn -= len;
      }
    }
    if( flags & 2 ){
      while( nIn>0 ){
        unsigned int len = 0;
        for(i=0; i<nChar; i++){
          len = aLen[i];
          if( len<=nIn && memcmp(&zIn[nIn-len],azChar[i],len)==0 ) break;
        }
        if( i>=nChar ) break;
        nIn -= len;
      }
    }
    if( zCharSet ){
      sqlite3_free(azChar);
    }
  }
  sqlite3_result_text(context, (char*)zIn, nIn, SQLITE_TRANSIENT);
}